

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O1

PropertyID lunasvg::csspropertyid(string_view *name)

{
  ulong uVar1;
  char *__s2;
  size_t __n;
  PropertyID PVar2;
  int iVar3;
  ulong __n_00;
  long lVar4;
  difference_type __d;
  ulong uVar5;
  ulong uVar6;
  anon_struct_24_2_b8fd76e8 *paVar7;
  
  uVar1 = name->_M_len;
  __s2 = name->_M_str;
  paVar7 = csspropertyid::table;
  uVar6 = 0x23;
  do {
    uVar5 = uVar6 >> 1;
    __n_00 = paVar7[uVar5].name._M_len;
    lVar4 = __n_00 - uVar1;
    if (uVar1 <= __n_00) {
      __n_00 = uVar1;
    }
    if (__n_00 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = memcmp(paVar7[uVar5].name._M_str,__s2,__n_00);
    }
    if (iVar3 == 0) {
      if (lVar4 < -0x7fffffff) {
        lVar4 = -0x80000000;
      }
      if (0x7ffffffe < lVar4) {
        lVar4 = 0x7fffffff;
      }
      iVar3 = (int)lVar4;
    }
    if (iVar3 < 0) {
      paVar7 = paVar7 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar6;
    }
    uVar6 = uVar5;
  } while (0 < (long)uVar5);
  if ((paVar7 == (anon_struct_24_2_b8fd76e8 *)&DAT_0015acb8) ||
     (__n = (paVar7->name)._M_len, __n != uVar1)) {
LAB_0011f405:
    PVar2 = Unknown;
  }
  else {
    if (__n != 0) {
      iVar3 = bcmp((paVar7->name)._M_str,__s2,__n);
      if (iVar3 != 0) goto LAB_0011f405;
    }
    PVar2 = paVar7->value;
  }
  return PVar2;
}

Assistant:

PropertyID csspropertyid(const std::string_view& name)
{
    static const struct {
        std::string_view name;
        PropertyID value;
    } table[] = {
        {"alignment-baseline", PropertyID::Alignment_Baseline},
        {"baseline-shift", PropertyID::Baseline_Shift},
        {"clip-path", PropertyID::Clip_Path},
        {"clip-rule", PropertyID::Clip_Rule},
        {"color", PropertyID::Color},
        {"direction", PropertyID::Direction},
        {"display", PropertyID::Display},
        {"dominant-baseline", PropertyID::Dominant_Baseline},
        {"fill", PropertyID::Fill},
        {"fill-opacity", PropertyID::Fill_Opacity},
        {"fill-rule", PropertyID::Fill_Rule},
        {"font-family", PropertyID::Font_Family},
        {"font-size", PropertyID::Font_Size},
        {"font-style", PropertyID::Font_Style},
        {"font-weight", PropertyID::Font_Weight},
        {"marker-end", PropertyID::Marker_End},
        {"marker-mid", PropertyID::Marker_Mid},
        {"marker-start", PropertyID::Marker_Start},
        {"mask", PropertyID::Mask},
        {"mask-type", PropertyID::Mask_Type},
        {"opacity", PropertyID::Opacity},
        {"overflow", PropertyID::Overflow},
        {"stop-color", PropertyID::Stop_Color},
        {"stop-opacity", PropertyID::Stop_Opacity},
        {"stroke", PropertyID::Stroke},
        {"stroke-dasharray", PropertyID::Stroke_Dasharray},
        {"stroke-dashoffset", PropertyID::Stroke_Dashoffset},
        {"stroke-linecap", PropertyID::Stroke_Linecap},
        {"stroke-linejoin", PropertyID::Stroke_Linejoin},
        {"stroke-miterlimit", PropertyID::Stroke_Miterlimit},
        {"stroke-opacity", PropertyID::Stroke_Opacity},
        {"stroke-width", PropertyID::Stroke_Width},
        {"text-anchor", PropertyID::Text_Anchor},
        {"visibility", PropertyID::Visibility},
        {"white-space", PropertyID::WhiteSpace}
    };

    auto it = std::lower_bound(table, std::end(table), name, [](const auto& item, const auto& name) { return item.name < name; });
    if(it == std::end(table) || it->name != name)
        return PropertyID::Unknown;
    return it->value;
}